

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O3

void __thiscall UIContext::Detail::ActivateContext(Detail *this)

{
  ImGuiContext *pIVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  ImGuiContext *ctx;
  byte bVar5;
  
  bVar5 = 0;
  pIVar1 = ImGui::GetCurrentContext();
  ctx = this->_context;
  if (pIVar1 != ctx) {
    if (pIVar1 != (ImGuiContext *)0x0) {
      memcpy(&ctx->Style,&pIVar1->Style,0x3a0);
      piVar3 = (pIVar1->IO).KeyMap;
      piVar4 = (this->_context->IO).KeyMap;
      for (lVar2 = 0x15; lVar2 != 0; lVar2 = lVar2 + -1) {
        *piVar4 = *piVar3;
        piVar3 = piVar3 + (ulong)bVar5 * -2 + 1;
        piVar4 = piVar4 + (ulong)bVar5 * -2 + 1;
      }
      ctx = this->_context;
      (ctx->IO).IniFilename = (pIVar1->IO).IniFilename;
      (ctx->IO).RenderDrawListsFn = (pIVar1->IO).RenderDrawListsFn;
      ctx->Initialized = pIVar1->Initialized;
    }
    ImGui::SetCurrentContext(ctx);
    return;
  }
  return;
}

Assistant:

void ActivateContext()
    {
        ImGuiContext* prevContext = ImGui::GetCurrentContext();
        if (prevContext == _context)
            return;

        if (prevContext != nullptr)
        {
            std::memcpy(&_context->Style, &prevContext->Style, sizeof(ImGuiStyle));
            std::memcpy(&_context->IO.KeyMap, &prevContext->IO.KeyMap, sizeof(prevContext->IO.KeyMap));
            //std::memcpy(&_context->MouseCursorData, &prevContext->MouseCursorData, sizeof(_context->MouseCursorData));
            _context->IO.IniFilename = prevContext->IO.IniFilename;
            _context->IO.RenderDrawListsFn = prevContext->IO.RenderDrawListsFn;
            _context->Initialized = prevContext->Initialized;
        }

        ImGui::SetCurrentContext(_context);
    }